

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitTestOutput.cpp
# Opt level: O2

void __thiscall JUnitTestOutput::writeTestGroupToFile(JUnitTestOutput *this)

{
  SimpleString SStack_18;
  
  (*(this->super_TestOutput)._vptr_TestOutput[0x15])
            (&SStack_18,this,&(this->impl_->results_).group_);
  (*(this->super_TestOutput)._vptr_TestOutput[0x16])(this,&SStack_18);
  SimpleString::~SimpleString(&SStack_18);
  (*(this->super_TestOutput)._vptr_TestOutput[0x1a])(this);
  (*(this->super_TestOutput)._vptr_TestOutput[0x1b])(this);
  (*(this->super_TestOutput)._vptr_TestOutput[0x1c])(this);
  (*(this->super_TestOutput)._vptr_TestOutput[0x1d])(this);
  (*(this->super_TestOutput)._vptr_TestOutput[0x1f])(this);
  (*(this->super_TestOutput)._vptr_TestOutput[0x19])(this);
  return;
}

Assistant:

void JUnitTestOutput::writeTestGroupToFile()
{
    openFileForWrite(createFileName(impl_->results_.group_));
    writeXmlHeader();
    writeTestSuiteSummary();
    writeProperties();
    writeTestCases();
    writeFileEnding();
    closeFile();
}